

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O1

Clause * Inferences::replaceLits
                   (Clause *c,Literal *a,Literal *b,InferenceRule r,bool incAge,Literal *d,
                   Literal *e)

{
  Literal ***pppLVar1;
  uint uVar2;
  Self SVar3;
  Literal **ppLVar4;
  Literal **ppLVar5;
  Clause *pCVar6;
  uint uVar7;
  Literal *pLVar8;
  Literal **ppLVar9;
  ulong uVar10;
  RStack<Literal_*> lits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_90;
  Literal *local_80;
  Literal *local_78;
  NonspecificInference1 local_70;
  Inference local_60;
  
  local_80 = d;
  local_78 = b;
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_90);
  uVar7 = *(uint *)&c->field_0x38 & 0xfffff;
  if (uVar7 != 0) {
    uVar10 = (ulong)(uVar7 != 0);
    ppLVar4 = c->_literals;
    ppLVar5 = c->_literals + uVar10;
    do {
      SVar3._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )local_90._self;
      pLVar8 = *ppLVar4;
      if (*ppLVar4 == a) {
        pLVar8 = local_78;
      }
      if (*(Literal ***)
           ((long)local_90._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) == *(Literal ***)
                 ((long)local_90._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
        ::Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   local_90._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
      }
      **(Literal ***)
        ((long)SVar3._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           pLVar8;
      pppLVar1 = (Literal ***)
                 ((long)SVar3._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      *pppLVar1 = *pppLVar1 + 1;
      uVar2 = (uint)uVar10;
      ppLVar9 = ppLVar5 + 1;
      if (uVar7 <= uVar2) {
        ppLVar5 = (Literal **)0x0;
      }
      uVar10 = (ulong)(uVar2 + 1);
      ppLVar4 = ppLVar5;
      ppLVar5 = ppLVar9;
    } while (uVar2 < uVar7);
  }
  pLVar8 = local_80;
  SVar3._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
        )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
          )local_90._self;
  if (local_80 != (Literal *)0x0) {
    if (*(Literal ***)
         ((long)local_90._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
        == *(Literal ***)
            ((long)local_90._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x18)) {
      ::Lib::Stack<Kernel::Literal_*>::expand
                ((Stack<Kernel::Literal_*> *)
                 local_90._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
    }
    **(Literal ***)
      ((long)SVar3._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
         pLVar8;
    pppLVar1 = (Literal ***)
               ((long)SVar3._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10);
    *pppLVar1 = *pppLVar1 + 1;
  }
  local_70.rule = r;
  local_70.premise = &c->super_Unit;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar6 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_90._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  (pCVar6->super_Unit)._inference._age = (uint)incAge + (c->super_Unit)._inference._age;
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_90);
  return pCVar6;
}

Assistant:

Clause* replaceLits(Clause *c, Literal *a, Literal *b, InferenceRule r, bool incAge, Literal *d, Literal* e)
{
  RStack<Literal*> lits;

  unsigned i = 0;
  while ((*c)[i] != a) { i++; }
  for (auto l : iterTraits(c->iterLits())) {
    lits->push(l == a ? b : l);
  }
  // adding new literals at differrent places...
  if (d) { lits->push(d); }
  if (e) { lits->push(e); }
  
  auto out = Clause::fromStack(*lits, NonspecificInference1(r, c));
  // Can be either generating or simplifying. Therefore use NonspecificInference
  // Age is updated in some instances, but not in others based on empirical evaluation
  out->setAge(incAge? c->age() + 1 : c->age());
  return out;
}